

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::BasicBufferBind::Run(BasicBufferBind *this)

{
  bool bVar1;
  GLuint local_38;
  int local_34;
  GLint index_2;
  GLint i;
  long res;
  GLuint local_20;
  GLint index_1;
  GLint index;
  GLint bindings;
  BasicBufferBind *this_local;
  
  _index = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92dc,&index_1);
  glcts::anon_unknown_0::Output("MAX_ATOMIC_COUNTER_BUFFER_BINDINGS: %d\n",(ulong)(uint)index_1);
  bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckGetCommands
                    (&this->super_SACSubcaseBase,0x92c1,0);
  if (bVar1) {
    for (local_20 = 0; (int)local_20 < index_1; local_20 = local_20 + 1) {
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                        (&this->super_SACSubcaseBase,local_20,0,0,0);
      if (!bVar1) {
        return (long)&DAT_ffffffffffffffff;
      }
    }
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               1,&this->buffer_);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,this->buffer_);
    bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckGetCommands
                      (&this->super_SACSubcaseBase,0x92c1,this->buffer_);
    if (bVar1) {
      for (res._4_4_ = 0; (int)res._4_4_ < index_1; res._4_4_ = res._4_4_ + 1) {
        bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                          (&this->super_SACSubcaseBase,res._4_4_,0,0,0);
        if (!bVar1) {
          return (long)&DAT_ffffffffffffffff;
        }
      }
      _index_2 = (BasicBufferBind *)0x0;
      glu::CallLogWrapper::glBufferData
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,1000,(void *)0x0,0x88ea);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,0);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,0,this->buffer_);
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                        (&this->super_SACSubcaseBase,0,this->buffer_,0,1000);
      if (!bVar1) {
        _index_2 = (BasicBufferBind *)&DAT_ffffffffffffffff;
      }
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckGetCommands
                        (&this->super_SACSubcaseBase,0x92c1,this->buffer_);
      if (!bVar1) {
        _index_2 = (BasicBufferBind *)&DAT_ffffffffffffffff;
      }
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,index_1 / 2,this->buffer_);
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                        (&this->super_SACSubcaseBase,index_1 / 2,this->buffer_,0,1000);
      if (!bVar1) {
        _index_2 = (BasicBufferBind *)&DAT_ffffffffffffffff;
      }
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,index_1 - 1,this->buffer_);
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                        (&this->super_SACSubcaseBase,index_1 - 1,this->buffer_,0,1000);
      if (!bVar1) {
        _index_2 = (BasicBufferBind *)&DAT_ffffffffffffffff;
      }
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,0);
      glu::CallLogWrapper::glBindBufferRange
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,0,this->buffer_,8,0x20);
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                        (&this->super_SACSubcaseBase,0,this->buffer_,8,0x20);
      if (!bVar1) {
        _index_2 = (BasicBufferBind *)&DAT_ffffffffffffffff;
      }
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckGetCommands
                        (&this->super_SACSubcaseBase,0x92c1,this->buffer_);
      if (!bVar1) {
        _index_2 = (BasicBufferBind *)&DAT_ffffffffffffffff;
      }
      glu::CallLogWrapper::glBindBufferRange
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,index_1 / 2,this->buffer_,0x200,100);
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                        (&this->super_SACSubcaseBase,index_1 / 2,this->buffer_,0x200,100);
      if (!bVar1) {
        _index_2 = (BasicBufferBind *)&DAT_ffffffffffffffff;
      }
      glu::CallLogWrapper::glBindBufferRange
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c0,index_1 - 1,this->buffer_,0xc,0x80);
      bVar1 = glcts::anon_unknown_0::SACSubcaseBase::CheckBufferBindingState
                        (&this->super_SACSubcaseBase,index_1 - 1,this->buffer_,0xc,0x80);
      if (!bVar1) {
        _index_2 = (BasicBufferBind *)&DAT_ffffffffffffffff;
      }
      glu::CallLogWrapper::glDeleteBuffers
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->buffer_);
      this->buffer_ = 0;
      glu::CallLogWrapper::glGetIntegerv
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x92c1,&local_34);
      if (local_34 != 0) {
        glcts::anon_unknown_0::Output
                  ("Generic binding point should be 0 after deleting bound buffer object.\n");
        _index_2 = (BasicBufferBind *)&DAT_ffffffffffffffff;
      }
      for (local_38 = 0; (int)local_38 < index_1; local_38 = local_38 + 1) {
        glu::CallLogWrapper::glGetIntegeri_v
                  (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x92c1,local_38,&local_34);
        if (local_34 != 0) {
          glcts::anon_unknown_0::Output
                    ("Binding point %u should be 0 after deleting bound buffer object.\n",
                     (ulong)local_38);
          _index_2 = (BasicBufferBind *)&DAT_ffffffffffffffff;
        }
      }
      this_local = _index_2;
    }
    else {
      this_local = (BasicBufferBind *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicBufferBind *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		GLint bindings;
		glGetIntegerv(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, &bindings);
		Output("MAX_ATOMIC_COUNTER_BUFFER_BINDINGS: %d\n", bindings);

		if (!CheckGetCommands(GL_ATOMIC_COUNTER_BUFFER_BINDING, 0))
			return ERROR;
		for (GLint index = 0; index < bindings; ++index)
		{
			if (!CheckBufferBindingState(static_cast<GLuint>(index), 0, 0, 0))
				return ERROR;
		}

		glGenBuffers(1, &buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);

		if (!CheckGetCommands(GL_ATOMIC_COUNTER_BUFFER_BINDING, static_cast<GLint>(buffer_)))
			return ERROR;
		for (GLint index = 0; index < bindings; ++index)
		{
			if (!CheckBufferBindingState(static_cast<GLuint>(index), 0, 0, 0))
				return ERROR;
		}

		long res = NO_ERROR;

		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 1000, NULL, GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, buffer_);
		if (!CheckBufferBindingState(0, static_cast<GLint>(buffer_), 0, 1000))
			res = ERROR;
		if (!CheckGetCommands(GL_ATOMIC_COUNTER_BUFFER_BINDING, static_cast<GLint>(buffer_)))
			res = ERROR;

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, static_cast<GLuint>(bindings / 2), buffer_);
		if (!CheckBufferBindingState(static_cast<GLuint>(bindings / 2), static_cast<GLint>(buffer_), 0, 1000))
			res = ERROR;

		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, static_cast<GLuint>(bindings - 1), buffer_);
		if (!CheckBufferBindingState(static_cast<GLuint>(bindings - 1), static_cast<GLint>(buffer_), 0, 1000))
			res = ERROR;
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, buffer_, 8, 32);
		if (!CheckBufferBindingState(0, static_cast<GLint>(buffer_), 8, 32))
			res = ERROR;
		if (!CheckGetCommands(GL_ATOMIC_COUNTER_BUFFER_BINDING, static_cast<GLint>(buffer_)))
			res = ERROR;

		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, static_cast<GLuint>(bindings / 2), buffer_, 512, 100);
		if (!CheckBufferBindingState(static_cast<GLuint>(bindings / 2), static_cast<GLint>(buffer_), 512, 100))
			res = ERROR;

		glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, static_cast<GLuint>(bindings - 1), buffer_, 12, 128);
		if (!CheckBufferBindingState(static_cast<GLuint>(bindings - 1), static_cast<GLint>(buffer_), 12, 128))
			res = ERROR;

		glDeleteBuffers(1, &buffer_);
		buffer_ = 0;

		GLint i;
		glGetIntegerv(GL_ATOMIC_COUNTER_BUFFER_BINDING, &i);
		if (i != 0)
		{
			Output("Generic binding point should be 0 after deleting bound buffer object.\n");
			res = ERROR;
		}
		for (GLint index = 0; index < bindings; ++index)
		{
			glGetIntegeri_v(GL_ATOMIC_COUNTER_BUFFER_BINDING, static_cast<GLuint>(index), &i);
			if (i != 0)
			{
				Output("Binding point %u should be 0 after deleting bound buffer object.\n", index);
				res = ERROR;
			}
		}

		return res;
	}